

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O2

shared_ptr<vmips::MemoryLocation> __thiscall vmips::Function::new_memory(Function *this,size_t size)

{
  long *plVar1;
  long lVar2;
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<vmips::MemoryLocation> sVar3;
  __shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  std::make_shared<vmips::MemoryLocation>();
  plVar1 = (long *)(this->name)._M_dataplus._M_p;
  plVar1[2] = in_RDX;
  lVar2 = *(long *)(size + 0x28);
  *(long *)(size + 0x28) = lVar2 + 1;
  *plVar1 = lVar2;
  *(undefined4 *)(plVar1 + 6) = 1;
  plVar1[1] = -1;
  get_special((vmips *)&_Stack_28,s8);
  std::__shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2> *)
             ((this->name)._M_dataplus._M_p + 0x20),&_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  std::
  vector<std::shared_ptr<vmips::MemoryLocation>,_std::allocator<std::shared_ptr<vmips::MemoryLocation>_>_>
  ::push_back((vector<std::shared_ptr<vmips::MemoryLocation>,_std::allocator<std::shared_ptr<vmips::MemoryLocation>_>_>
               *)(size + 0xf0),(value_type *)this);
  sVar3.super___shared_ptr<vmips::MemoryLocation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<vmips::MemoryLocation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<vmips::MemoryLocation>)
         sVar3.super___shared_ptr<vmips::MemoryLocation,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MemoryLocation> Function::new_memory(size_t size) {
    auto res = std::make_shared<MemoryLocation>();
    res->size = size;
    res->identifier = memory_count++;
    res->status = MemoryLocation::Undetermined;
    res->offset = -1;
    res->base = get_special(SpecialReg::s8);
    mem_blocks.push_back(res);
    return res;
}